

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O3

void Handler_damagescreencolor_Cfs_PlayerPawn
               (APlayerPawn *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  double dVar1;
  char *text;
  PClass *pPVar2;
  int iVar3;
  PClass *pPVar4;
  bool bVar5;
  double dVar6;
  PalEntry color;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_20;
  FName local_1c;
  
  if (params[1].i == 0) {
    iVar3 = params[2].i;
  }
  else {
    iVar3 = V_GetColor((DWORD *)0x0,params[2].s,(FScriptPosition *)0x0);
  }
  pPVar2 = PClassPlayerPawn::RegistrationInfo.MyClass;
  local_20.d._0_3_ = (undefined3)iVar3;
  if (params->i < 3) {
    local_20.field_0.a = 0xff;
  }
  else {
    dVar1 = params[3].d;
    if (params->i != 3) {
      text = params[4].s;
      dVar6 = 1.0;
      if (dVar1 <= 1.0) {
        dVar6 = dVar1;
      }
      local_20.field_0.a = (char)(int)(double)(-(ulong)(0.0 < dVar1) & (ulong)(dVar6 * 255.0));
      pPVar4 = *(PClass **)
                ((long)&(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                        super_PCompoundType.super_PType.super_PTypeBase + 8);
      if (pPVar4 == (PClass *)0x0) {
        pPVar4 = (PClass *)
                 (*(code *)**(undefined8 **)
                             &(info->super_PClass).super_PNativeStruct.super_PStruct.
                              super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase)
                           (info);
        *(PClass **)
         ((long)&(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                 super_PCompoundType.super_PType.super_PTypeBase + 8) = pPVar4;
      }
      bVar5 = pPVar4 != (PClass *)0x0;
      if (pPVar4 != pPVar2 && bVar5) {
        do {
          pPVar4 = pPVar4->ParentClass;
          bVar5 = pPVar4 != (PClass *)0x0;
          if (pPVar4 == pPVar2) break;
        } while (pPVar4 != (PClass *)0x0);
      }
      if (bVar5) {
        local_1c.Index = FName::NameManager::FindName(&FName::NameData,text,false);
        TMap<FName,_PalEntry,_THashTraits<FName>,_TValueTraits<PalEntry>_>::Insert
                  ((TMap<FName,_PalEntry,_THashTraits<FName>,_TValueTraits<PalEntry>_> *)
                   &info[1].super_PClass.SpecialInits,&local_1c,(PalEntry *)&local_20.field_0);
        return;
      }
      __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                    ,0xb3d,
                    "void Handler_damagescreencolor_Cfs_PlayerPawn(APlayerPawn *, PClassActor *, Baggage &, FPropParam *)"
                   );
    }
    dVar6 = 1.0;
    if (dVar1 <= 1.0) {
      dVar6 = dVar1;
    }
    local_20.field_0.a = (char)(int)(double)(-(ulong)(0.0 < dVar1) & (ulong)(dVar6 * 255.0));
  }
  (defaults->DamageFade).field_0 = local_20;
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(player, damagescreencolor, Cfs, PlayerPawn)
{
	PROP_COLOR_PARM(c, 0);

	PalEntry color = c;

	if (PROP_PARM_COUNT < 3)		// Because colors count as 2 parms
	{
		color.a = 255;
		defaults->DamageFade = color;
	}
	else if (PROP_PARM_COUNT < 4)
	{
		PROP_DOUBLE_PARM(a, 2);

		color.a = BYTE(255 * clamp<double>(a, 0.f, 1.f));
		defaults->DamageFade = color;
	}
	else
	{
		PROP_DOUBLE_PARM(a, 2);
		PROP_STRING_PARM(type, 3);

		color.a = BYTE(255 * clamp<double>(a, 0.f, 1.f));
		assert(info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn)));
		static_cast<PClassPlayerPawn *>(info)->PainFlashes.Insert(type, color);
	}
}